

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

_Bool al_wait_for_event_timed(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event,float secs)

{
  _Bool _Var1;
  ALLEGRO_EVENT *in_RSI;
  ALLEGRO_EVENT_QUEUE *in_RDI;
  float in_XMM0_Da;
  ALLEGRO_TIMEOUT timeout;
  double in_stack_ffffffffffffffd8;
  ALLEGRO_TIMEOUT *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  heartbeat();
  if (0.0 <= in_XMM0_Da) {
    al_init_timeout(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    al_init_timeout(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  _Var1 = do_wait_for_event(in_RDI,in_RSI,
                            (ALLEGRO_TIMEOUT *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8));
  return _Var1;
}

Assistant:

bool al_wait_for_event_timed(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT *ret_event, float secs)
{
   ALLEGRO_TIMEOUT timeout;

   ASSERT(queue);
   ASSERT(secs >= 0);

   heartbeat();

   if (secs < 0.0)
      al_init_timeout(&timeout, 0);
   else
      al_init_timeout(&timeout, secs);

   return do_wait_for_event(queue, ret_event, &timeout);
}